

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

SUNErrCode SUNMatMatvec_Dense(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  sunindextype i_1;
  sunrealtype *col_j;
  sunindextype j;
  sunindextype i;
  sunrealtype *yd;
  sunrealtype *xd;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_50;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar2 = N_VGetArrayPointer(in_RSI);
  lVar3 = N_VGetArrayPointer(in_RDX);
  for (local_38 = 0; local_38 < *(long *)*in_RDI; local_38 = local_38 + 1) {
    *(undefined8 *)(lVar3 + local_38 * 8) = 0;
  }
  for (local_40 = 0; local_40 < *(long *)(*in_RDI + 8); local_40 = local_40 + 1) {
    lVar1 = *(long *)(*(long *)(*in_RDI + 0x20) + local_40 * 8);
    for (local_50 = 0; local_50 < *(long *)*in_RDI; local_50 = local_50 + 1) {
      *(double *)(lVar3 + local_50 * 8) =
           *(double *)(lVar1 + local_50 * 8) * *(double *)(lVar2 + local_40 * 8) +
           *(double *)(lVar3 + local_50 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatMatvec_Dense(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);
  sunrealtype *xd, *yd;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrixAndVectors(A, x, y), SUN_ERR_ARG_DIMSMISMATCH);

  /* access vector data (return if NULL data pointers) */
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  SUNAssert(xd, SUN_ERR_MEM_FAIL);
  SUNAssert(yd, SUN_ERR_MEM_FAIL);
  SUNAssert(xd != yd, SUN_ERR_MEM_FAIL);

  /* Perform operation y = Ax */
  for (sunindextype i = 0; i < SM_ROWS_D(A); i++) { yd[i] = ZERO; }
  for (sunindextype j = 0; j < SM_COLUMNS_D(A); j++)
  {
    sunrealtype* col_j = SM_COLUMN_D(A, j);
    for (sunindextype i = 0; i < SM_ROWS_D(A); i++)
    {
      yd[i] += col_j[i] * xd[j];
    }
  }
  return SUN_SUCCESS;
}